

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

timediff_t Curl_timeleft(Curl_easy *data,curltime *nowp,_Bool duringconnect)

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int *piVar6;
  timediff_t tVar7;
  undefined7 in_register_00000011;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  curltime cVar12;
  curltime newer;
  curltime older;
  curltime older_00;
  int local_40 [2];
  time_t local_38;
  
  uVar10 = (ulong)(data->set).timeout;
  bVar8 = (uVar10 != 0) * '\x02';
  if ((int)CONCAT71(in_register_00000011,duringconnect) == 0) {
    uVar9 = 0;
  }
  else {
    bVar8 = bVar8 | 1;
    uVar1 = (data->set).connecttimeout;
    uVar9 = 300000;
    if (uVar1 != 0) {
      uVar9 = (ulong)uVar1;
    }
  }
  if (bVar8 == 0) {
    uVar11 = 0;
  }
  else {
    if (nowp == (curltime *)0x0) {
      cVar12 = Curl_now();
      nowp = (curltime *)&local_38;
      local_38 = cVar12.tv_sec;
      piVar6 = local_40;
      local_40[0] = cVar12.tv_usec;
    }
    else {
      piVar6 = &nowp->tv_usec;
    }
    if (uVar10 == 0) {
      uVar11 = 0;
    }
    else {
      uVar2 = (data->progress).t_startop.tv_sec;
      uVar3 = (data->progress).t_startop.tv_usec;
      older.tv_usec = uVar3;
      older.tv_sec = uVar2;
      cVar12.tv_usec = *piVar6;
      cVar12.tv_sec = nowp->tv_sec;
      cVar12._12_4_ = 0;
      older._12_4_ = 0;
      tVar7 = Curl_timediff(cVar12,older);
      uVar11 = uVar10 - tVar7;
    }
    if ((bVar8 & 1) != 0) {
      uVar4 = (data->progress).t_startsingle.tv_sec;
      uVar5 = (data->progress).t_startsingle.tv_usec;
      older_00.tv_usec = uVar5;
      older_00.tv_sec = uVar4;
      newer.tv_usec = *piVar6;
      newer.tv_sec = nowp->tv_sec;
      newer._12_4_ = 0;
      older_00._12_4_ = 0;
      tVar7 = Curl_timediff(newer,older_00);
      uVar9 = uVar9 - tVar7;
      if ((long)uVar9 < (long)uVar11) {
        uVar11 = uVar9;
      }
      if (uVar10 == 0) {
        uVar11 = uVar9;
      }
    }
    uVar11 = -(ulong)(uVar11 == 0) | uVar11;
  }
  return uVar11;
}

Assistant:

timediff_t Curl_timeleft(struct Curl_easy *data,
                         struct curltime *nowp,
                         bool duringconnect)
{
  unsigned int timeout_set = 0;
  timediff_t connect_timeout_ms = 0;
  timediff_t maxtime_timeout_ms = 0;
  timediff_t timeout_ms = 0;
  struct curltime now;

  /* The duration of a connect and the total transfer are calculated from two
     different time-stamps. It can end up with the total timeout being reached
     before the connect timeout expires and we must acknowledge whichever
     timeout that is reached first. The total timeout is set per entire
     operation, while the connect timeout is set per connect. */

  if(data->set.timeout > 0) {
    timeout_set = TIMEOUT_MAXTIME;
    maxtime_timeout_ms = data->set.timeout;
  }
  if(duringconnect) {
    timeout_set |= TIMEOUT_CONNECT;
    connect_timeout_ms = (data->set.connecttimeout > 0) ?
      data->set.connecttimeout : DEFAULT_CONNECT_TIMEOUT;
  }
  if(!timeout_set)
    /* no timeout  */
    return 0;

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }

  if(timeout_set & TIMEOUT_MAXTIME) {
    maxtime_timeout_ms -= Curl_timediff(*nowp, data->progress.t_startop);
    timeout_ms = maxtime_timeout_ms;
  }

  if(timeout_set & TIMEOUT_CONNECT) {
    connect_timeout_ms -= Curl_timediff(*nowp, data->progress.t_startsingle);

    if(!(timeout_set & TIMEOUT_MAXTIME) ||
       (connect_timeout_ms < maxtime_timeout_ms))
      timeout_ms = connect_timeout_ms;
  }

  if(!timeout_ms)
    /* avoid returning 0 as that means no timeout! */
    return -1;

  return timeout_ms;
}